

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

void Ivy_ObjPrintVerbose(Ivy_Man_t *p,Ivy_Obj_t *pObj,int fHaig)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Ivy_Obj_t *pIVar4;
  char *pcVar5;
  char *pcVar6;
  int i;
  Ivy_Obj_t *pFanout;
  Vec_Ptr_t *vFanouts;
  Ivy_Obj_t *pIStack_28;
  int fShowFanouts;
  Ivy_Obj_t *pTemp;
  int fHaig_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar2 = Ivy_IsComplement(pObj);
  if (iVar2 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyUtil.c"
                  ,0x279,"void Ivy_ObjPrintVerbose(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  uVar3 = Ivy_ObjId(pObj);
  printf("Node %5d : ",(ulong)uVar3);
  iVar2 = Ivy_ObjIsConst1(pObj);
  if (iVar2 == 0) {
    iVar2 = Ivy_ObjIsPi(pObj);
    if (iVar2 == 0) {
      iVar2 = Ivy_ObjIsPo(pObj);
      if (iVar2 == 0) {
        iVar2 = Ivy_ObjIsLatch(pObj);
        if (iVar2 == 0) {
          iVar2 = Ivy_ObjIsBuf(pObj);
          if (iVar2 == 0) {
            pIVar4 = Ivy_ObjFanin0(pObj);
            uVar3 = pIVar4->Id;
            iVar2 = Ivy_ObjFaninC0(pObj);
            pcVar5 = " ";
            if (iVar2 != 0) {
              pcVar5 = "\'";
            }
            pIVar4 = Ivy_ObjFanin1(pObj);
            uVar1 = pIVar4->Id;
            iVar2 = Ivy_ObjFaninC1(pObj);
            pcVar6 = " ";
            if (iVar2 != 0) {
              pcVar6 = "\'";
            }
            printf("AND( %5d%s, %5d%s )",(ulong)uVar3,pcVar5,(ulong)uVar1,pcVar6);
          }
          else {
            pIVar4 = Ivy_ObjFanin0(pObj);
            uVar3 = pIVar4->Id;
            iVar2 = Ivy_ObjFaninC0(pObj);
            pcVar5 = " ";
            if (iVar2 != 0) {
              pcVar5 = "\'";
            }
            printf("buffer (%d%s)",(ulong)uVar3,pcVar5);
          }
        }
        else {
          pIVar4 = Ivy_ObjFanin0(pObj);
          uVar3 = pIVar4->Id;
          iVar2 = Ivy_ObjFaninC0(pObj);
          pcVar5 = " ";
          if (iVar2 != 0) {
            pcVar5 = "\'";
          }
          printf("latch (%d%s)",(ulong)uVar3,pcVar5);
        }
      }
      else {
        printf("PO");
      }
    }
    else {
      printf("PI");
    }
  }
  else {
    printf("constant 1");
  }
  uVar3 = Ivy_ObjRefs(pObj);
  printf(" (refs = %3d)",(ulong)uVar3);
  if (fHaig == 0) {
    if (pObj->pEquiv == (Ivy_Obj_t *)0x0) {
      printf(" HAIG node not given");
    }
    else {
      pIVar4 = Ivy_Regular(pObj->pEquiv);
      uVar3 = pIVar4->Id;
      iVar2 = Ivy_IsComplement(pObj->pEquiv);
      pcVar5 = " ";
      if (iVar2 != 0) {
        pcVar5 = "\'";
      }
      printf(" HAIG node = %d%s",(ulong)uVar3,pcVar5);
    }
  }
  else if (pObj->pEquiv != (Ivy_Obj_t *)0x0) {
    iVar2 = Ivy_ObjRefs(pObj);
    if (iVar2 < 1) {
      pIStack_28 = Ivy_Regular(pObj->pEquiv);
      while (iVar2 = Ivy_ObjRefs(pIStack_28), iVar2 == 0) {
        pIStack_28 = Ivy_Regular(pIStack_28->pEquiv);
      }
      iVar2 = Ivy_ObjRefs(pIStack_28);
      if (iVar2 < 1) {
        __assert_fail("Ivy_ObjRefs(pTemp) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyUtil.c"
                      ,699,"void Ivy_ObjPrintVerbose(Ivy_Man_t *, Ivy_Obj_t *, int)");
      }
      printf("  class of %d",(ulong)(uint)pIStack_28->Id);
    }
    else {
      printf("  { %5d ",(ulong)(uint)pObj->Id);
      iVar2 = Ivy_IsComplement(pObj->pEquiv);
      if (iVar2 != 0) {
        __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyUtil.c"
                      ,0x2b3,"void Ivy_ObjPrintVerbose(Ivy_Man_t *, Ivy_Obj_t *, int)");
      }
      for (pIStack_28 = pObj->pEquiv; pIStack_28 != pObj;
          pIStack_28 = Ivy_Regular(pIStack_28->pEquiv)) {
        uVar3 = pIStack_28->Id;
        iVar2 = Ivy_IsComplement(pIStack_28->pEquiv);
        pcVar5 = " ";
        if (iVar2 != 0) {
          pcVar5 = "\'";
        }
        printf(" %5d%s",(ulong)uVar3,pcVar5);
      }
      printf(" }");
    }
  }
  return;
}

Assistant:

void Ivy_ObjPrintVerbose( Ivy_Man_t * p, Ivy_Obj_t * pObj, int fHaig )
{
    Ivy_Obj_t * pTemp;
    int fShowFanouts = 0;
    assert( !Ivy_IsComplement(pObj) );
    printf( "Node %5d : ", Ivy_ObjId(pObj) );
    if ( Ivy_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( Ivy_ObjIsPi(pObj) )
        printf( "PI" );
    else if ( Ivy_ObjIsPo(pObj) )
        printf( "PO" );
    else if ( Ivy_ObjIsLatch(pObj) )
        printf( "latch (%d%s)", Ivy_ObjFanin0(pObj)->Id, (Ivy_ObjFaninC0(pObj)? "\'" : " ") );
    else if ( Ivy_ObjIsBuf(pObj) )
        printf( "buffer (%d%s)", Ivy_ObjFanin0(pObj)->Id, (Ivy_ObjFaninC0(pObj)? "\'" : " ") );
    else
        printf( "AND( %5d%s, %5d%s )", 
            Ivy_ObjFanin0(pObj)->Id, (Ivy_ObjFaninC0(pObj)? "\'" : " "), 
            Ivy_ObjFanin1(pObj)->Id, (Ivy_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", Ivy_ObjRefs(pObj) );
    if ( fShowFanouts )
    {
        Vec_Ptr_t * vFanouts;
        Ivy_Obj_t * pFanout;
        int i;
        vFanouts = Vec_PtrAlloc( 10 );
        printf( "\nFanouts:\n" );
        Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, i )
        {
            printf( "    " );
            printf( "Node %5d : ", Ivy_ObjId(pFanout) );
            if ( Ivy_ObjIsPo(pFanout) )
                printf( "PO" );
            else if ( Ivy_ObjIsLatch(pFanout) )
                printf( "latch (%d%s)", Ivy_ObjFanin0(pFanout)->Id, (Ivy_ObjFaninC0(pFanout)? "\'" : " ") );
            else if ( Ivy_ObjIsBuf(pFanout) )
                printf( "buffer (%d%s)", Ivy_ObjFanin0(pFanout)->Id, (Ivy_ObjFaninC0(pFanout)? "\'" : " ") );
            else
                printf( "AND( %5d%s, %5d%s )", 
                    Ivy_ObjFanin0(pFanout)->Id, (Ivy_ObjFaninC0(pFanout)? "\'" : " "), 
                    Ivy_ObjFanin1(pFanout)->Id, (Ivy_ObjFaninC1(pFanout)? "\'" : " ") );
            printf( "\n" );
        }
        Vec_PtrFree( vFanouts );
        return;
    }
    if ( !fHaig )
    {
        if ( pObj->pEquiv == NULL )
            printf( " HAIG node not given" );
        else
            printf( " HAIG node = %d%s", Ivy_Regular(pObj->pEquiv)->Id, (Ivy_IsComplement(pObj->pEquiv)? "\'" : " ") );
        return;
    }
    if ( pObj->pEquiv == NULL )
        return;
    // there are choices
    if ( Ivy_ObjRefs(pObj) > 0 )
    {
        // print equivalence class
        printf( "  { %5d ", pObj->Id );
        assert( !Ivy_IsComplement(pObj->pEquiv) );
        for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
            printf( " %5d%s", pTemp->Id, (Ivy_IsComplement(pTemp->pEquiv)? "\'" : " ") );
        printf( " }" );
        return;
    }
    // this is a secondary node
    for ( pTemp = Ivy_Regular(pObj->pEquiv); Ivy_ObjRefs(pTemp) == 0; pTemp = Ivy_Regular(pTemp->pEquiv) );
    assert( Ivy_ObjRefs(pTemp) > 0 );
    printf( "  class of %d", pTemp->Id );
}